

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O1

void __thiscall hgdb::json::Module::serialize_(Module *this,JSONWriter *w)

{
  pointer pcVar1;
  pointer ppVar2;
  pointer pvVar3;
  ulong __val;
  bool bVar4;
  char cVar5;
  JSONWriter *pJVar6;
  variant_alternative_t<1UL,_variant<Variable,_unsigned_long>_> *pvVar7;
  variant_alternative_t<0UL,_variant<Variable,_unsigned_long>_> *this_00;
  ulong uVar8;
  pointer ppVar9;
  char cVar10;
  pointer __v;
  string_view name;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  char local_c9;
  JSONWriter *local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  Module *local_a0;
  ostream *local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  name._M_str = "name";
  name._M_len = 4;
  local_c8 = w;
  pJVar6 = JSONWriter::key(w,name);
  pcVar1 = (this->name_)._M_dataplus._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + (this->name_)._M_string_length);
  JSONWriter::value<std::__cxx11::string>(pJVar6,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  name_00._M_str = "instances";
  name_00._M_len = 9;
  pJVar6 = JSONWriter::key(local_c8,name_00);
  local_c9 = '[';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pJVar6->field_0x10,&local_c9,1);
  ppVar9 = (this->instances_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (this->instances_).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_hgdb::json::Module_*>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_a0 = this;
  if (ppVar9 != ppVar2) {
    local_98 = (ostream *)&local_c8->field_0x10;
    do {
      local_c9 = '{';
      std::__ostream_insert<char,std::char_traits<char>>(local_98,&local_c9,1);
      name_01._M_str = "name";
      name_01._M_len = 4;
      pJVar6 = JSONWriter::key(local_c8,name_01);
      pcVar1 = (ppVar9->first)._M_dataplus._M_p;
      local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_70,pcVar1,pcVar1 + (ppVar9->first)._M_string_length);
      pJVar6 = JSONWriter::value<std::__cxx11::string>(pJVar6,&local_70);
      name_02._M_str = "module";
      name_02._M_len = 6;
      pJVar6 = JSONWriter::key(pJVar6,name_02);
      local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
      pcVar1 = (ppVar9->second->name_)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c0,pcVar1,pcVar1 + (ppVar9->second->name_)._M_string_length);
      pJVar6 = JSONWriter::value<std::__cxx11::string>(pJVar6,&local_c0);
      JSONWriter::end_obj(pJVar6);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70._M_dataplus._M_p != &local_70.field_2) {
        operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
      }
      ppVar9 = ppVar9 + 1;
    } while (ppVar9 != ppVar2);
  }
  pJVar6 = local_c8;
  JSONWriter::end_array(local_c8);
  name_03._M_str = "variables";
  name_03._M_len = 9;
  pJVar6 = JSONWriter::key(pJVar6,name_03);
  local_c9 = '[';
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&pJVar6->field_0x10,&local_c9,1);
  __v = (local_a0->variables_).
        super__Vector_base<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  pvVar3 = (local_a0->variables_).
           super__Vector_base<std::variant<hgdb::json::Variable,_unsigned_long>,_std::allocator<std::variant<hgdb::json::Variable,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (__v != pvVar3) {
    do {
      if ((__v->super__Variant_base<hgdb::json::Variable,_unsigned_long>).
          super__Move_assign_alias<hgdb::json::Variable,_unsigned_long>.
          super__Copy_assign_alias<hgdb::json::Variable,_unsigned_long>.
          super__Move_ctor_alias<hgdb::json::Variable,_unsigned_long>.
          super__Copy_ctor_alias<hgdb::json::Variable,_unsigned_long>.
          super__Variant_storage_alias<hgdb::json::Variable,_unsigned_long>._M_index == '\0') {
        this_00 = std::get<0ul,hgdb::json::Variable,unsigned_long>(__v);
        Variable::serialize(this_00,local_c8);
      }
      else {
        pvVar7 = std::get<1ul,hgdb::json::Variable,unsigned_long>(__v);
        __val = *pvVar7;
        cVar10 = '\x01';
        if (9 < __val) {
          uVar8 = __val;
          cVar5 = '\x04';
          do {
            cVar10 = cVar5;
            if (uVar8 < 100) {
              cVar10 = cVar10 + -2;
              goto LAB_00148286;
            }
            if (uVar8 < 1000) {
              cVar10 = cVar10 + -1;
              goto LAB_00148286;
            }
            if (uVar8 < 10000) goto LAB_00148286;
            bVar4 = 99999 < uVar8;
            uVar8 = uVar8 / 10000;
            cVar5 = cVar10 + '\x04';
          } while (bVar4);
          cVar10 = cVar10 + '\x01';
        }
LAB_00148286:
        local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
        std::__cxx11::string::_M_construct((ulong)&local_90,cVar10);
        std::__detail::__to_chars_10_impl<unsigned_long>
                  (local_90._M_dataplus._M_p,(uint)local_90._M_string_length,__val);
        JSONWriter::value<std::__cxx11::string>(local_c8,&local_90);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
      }
      __v = __v + 1;
    } while (__v != pvVar3);
  }
  JSONWriter::end_array(local_c8);
  return;
}

Assistant:

void serialize_(JSONWriter &w) const override {
        w.key("name").value(name_);
        w.key("instances").begin_array();
        for (auto const &[name, m] : instances_) {
            w.begin_obj().key("name").value(name).key("module").value(m->name_).end_obj();
        }
        w.end_array();
        w.key("variables").begin_array();
        for (auto const &v : variables_) {
            if (v.index() == 0) {
                std::get<0>(v).serialize(w);
            } else {
                w.value(std::to_string(std::get<1>(v)));
            }
        }
        w.end_array();
    }